

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall File::output_text(File *this,ostream *out)

{
  vector<vm::Function,_std::allocator<vm::Function>_> *pvVar1;
  pointer pCVar2;
  pointer pIVar3;
  pointer pFVar4;
  Instruction *pIVar5;
  reference pvVar6;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar7;
  reference args;
  int iVar8;
  Instruction *ins_1;
  pointer pFVar9;
  Instruction *args_1;
  Constant *constant;
  pointer args_1_00;
  pointer args_1_01;
  Function *fun;
  int local_7c;
  File *local_78;
  int local_6c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string name;
  
  println<char[12]>(out,(char (*) [12])".constants:");
  pCVar2 = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
           .super__Vector_impl_data._M_finish;
  iVar8 = 1;
  local_78 = this;
  for (args_1_00 = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                   ._M_impl.super__Vector_impl_data._M_start; args_1_00 != pCVar2;
      args_1_00 = args_1_00 + 1) {
    name._M_dataplus._M_p._0_4_ = iVar8 + -1;
    local_7c = iVar8;
    println<int,vm::Constant>(out,(int *)&name,args_1_00);
    iVar8 = iVar8 + 1;
  }
  println<char[8]>(out,(char (*) [8])".start:");
  pIVar3 = (local_78->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  iVar8 = 1;
  for (args_1_01 = (local_78->start).
                   super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                   super__Vector_impl_data._M_start; args_1_01 != pIVar3; args_1_01 = args_1_01 + 1)
  {
    name._M_dataplus._M_p._0_4_ = iVar8 + -1;
    local_7c = iVar8;
    println<int,vm::Instruction>(out,(int *)&name,args_1_01);
    iVar8 = iVar8 + 1;
  }
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7c = 0;
  println<char[12]>(out,(char (*) [12])".functions:");
  pFVar4 = (local_78->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pFVar9 = (local_78->functions).
                super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                super__Vector_impl_data._M_start; pFVar9 != pFVar4; pFVar9 = pFVar9 + 1) {
    pvVar6 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::at
                       (&this->constants,(ulong)pFVar9->nameIndex);
    pvVar7 = std::get<0ul,std::__cxx11::string,int,double>(&pvVar6->value);
    std::__cxx11::string::string((string *)&name,(string *)pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&names,&name);
    local_6c = local_7c;
    local_7c = local_7c + 1;
    println<int,unsigned_short,unsigned_short,unsigned_short,char[2],std::__cxx11::string>
              (out,&local_6c,&pFVar9->nameIndex,&pFVar9->paramSize,&pFVar9->level,(char (*) [2])"#",
               &name);
    std::__cxx11::string::~string((string *)&name);
  }
  local_7c = 0;
  pvVar1 = &local_78->functions;
  local_78 = (File *)(local_78->functions).
                     super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  for (pFVar9 = (pvVar1->super__Vector_base<vm::Function,_std::allocator<vm::Function>_>)._M_impl.
                super__Vector_impl_data._M_start; (File *)pFVar9 != local_78; pFVar9 = pFVar9 + 1) {
    args = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&names,(long)local_7c);
    printfmt<int,std::__cxx11::string>(out,".F{}: # {}",&local_7c,args);
    std::endl<char,std::char_traits<char>>(out);
    pIVar5 = (pFVar9->instructions).
             super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar8 = 0;
    for (args_1 = (pFVar9->instructions).
                  super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                  super__Vector_impl_data._M_start; args_1 != pIVar5; args_1 = args_1 + 1) {
      name._M_dataplus._M_p._0_4_ = iVar8;
      println<int,vm::Instruction>(out,(int *)&name,args_1);
      iVar8 = iVar8 + 1;
    }
    local_7c = local_7c + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&names);
  return;
}

Assistant:

void File::output_text(std::ostream& out) {
    int i;
    
    i = 0;
    println(out, ".constants:");
    for (auto& constant : constants) {
        println(out, i++, constant);
    }

    i = 0;
    println(out, ".start:");
    for (auto& ins : start) {
        println(out, i++, ins);
    }

    std::vector<std::string> names;
    i = 0;
    println(out, ".functions:");
    for (auto& fun : functions) {
        std::string name = std::get<std::string>(constants.at(fun.nameIndex).value);
        names.push_back(name);
        println(out, i++, fun.nameIndex, fun.paramSize, fun.level, "#", name);
    }
    
    i = 0;
    for (auto& fun : functions) {
        printfmt(out, ".F{}: # {}", i, names.at(i)); println(out);
        int j = 0;
        for (auto& ins : fun.instructions) {
            println(out, j++, ins);
        }
        ++i;
    }
}